

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O3

int libtorrent::anon_unknown_1::path_length(bdecode_node *p,error_code *ec)

{
  bool bVar1;
  int iVar2;
  type_t tVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  error_code eVar7;
  bdecode_node e;
  bdecode_node local_70;
  
  iVar2 = bdecode_node::list_size(p);
  iVar5 = iVar2;
  if (0 < iVar2) {
    iVar6 = 0;
    bVar1 = true;
    iVar5 = 0;
    do {
      bdecode_node::list_at(&local_70,p,iVar5);
      tVar3 = bdecode_node::type(&local_70);
      if (tVar3 == string_t) {
        iVar4 = bdecode_node::string_length(&local_70);
        iVar6 = iVar6 + iVar4;
      }
      else {
        eVar7 = errors::make_error_code(torrent_invalid_name);
        ec->val_ = eVar7.val_;
        ec->failed_ = eVar7.failed_;
        *(int3 *)&ec->field_0x5 = eVar7._5_3_;
        ec->cat_ = eVar7.cat_;
      }
      if (local_70.m_tokens.
          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_70.m_tokens.
                        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_70.m_tokens.
                              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_70.m_tokens.
                              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (tVar3 != string_t) break;
      iVar5 = iVar5 + 1;
      bVar1 = iVar5 < iVar2;
    } while (iVar5 != iVar2);
    iVar5 = -1;
    if (!bVar1) {
      iVar5 = iVar6 + iVar2;
    }
  }
  return iVar5;
}

Assistant:

int path_length(bdecode_node const& p, error_code& ec)
	{
		int ret = 0;
		int const len = p.list_size();
		for (int i = 0; i < len; ++i)
		{
			bdecode_node const e = p.list_at(i);
			if (e.type() != bdecode_node::string_t)
			{
				ec = errors::torrent_invalid_name;
				return -1;
			}
			ret += e.string_length();
		}
		return ret + len;
	}